

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O2

char32_t jsonnet::internal::decode_utf8(string *str,size_t *i)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  pointer pcVar4;
  char32_t cVar5;
  char32_t cVar6;
  ulong uVar7;
  
  sVar3 = *i;
  pcVar4 = (str->_M_dataplus)._M_p;
  cVar5 = (char32_t)pcVar4[sVar3];
  if (-1 < pcVar4[sVar3]) {
    return cVar5;
  }
  if ((cVar5 & 0xe0U) == 0xc0) {
    uVar7 = sVar3 + 1;
    cVar6 = L'�';
    if (uVar7 < str->_M_string_length) {
      *i = uVar7;
      cVar6 = L'�';
      if ((pcVar4[uVar7] & 0xc0U) == 0x80) {
        cVar6 = (byte)pcVar4[uVar7] & 0x3f | (cVar5 & 0x1fU) << 6;
      }
      return cVar6;
    }
  }
  else if ((cVar5 & 0xf0U) == 0xe0) {
    uVar7 = sVar3 + 2;
    cVar6 = L'�';
    if (uVar7 < str->_M_string_length) {
      *i = sVar3 + 1;
      cVar1 = pcVar4[sVar3 + 1];
      if (((int)cVar1 & 0xc0U) == 0x80) {
        *i = uVar7;
        if (((byte)pcVar4[uVar7] & 0xffffffc0) == 0x80) {
          cVar6 = (byte)pcVar4[uVar7] & 0x3f | ((int)cVar1 & 0x3fU) << 6 | (cVar5 & 0xfU) << 0xc;
        }
      }
    }
  }
  else {
    cVar6 = L'�';
    if (((cVar5 & 0xf8U) == 0xf0) && (uVar7 = sVar3 + 3, uVar7 < str->_M_string_length)) {
      *i = sVar3 + 1;
      cVar1 = pcVar4[sVar3 + 1];
      if (((int)cVar1 & 0xc0U) == 0x80) {
        *i = sVar3 + 2;
        cVar2 = pcVar4[sVar3 + 2];
        if (((int)cVar2 & 0xc0U) == 0x80) {
          *i = uVar7;
          if (((byte)pcVar4[uVar7] & 0xffffffc0) == 0x80) {
            cVar6 = (byte)pcVar4[uVar7] & 0x3f |
                    ((int)cVar2 & 0x3fU) << 6 | ((int)cVar1 & 0x3fU) << 0xc | (cVar5 & 7U) << 0x12;
          }
        }
      }
    }
  }
  return cVar6;
}

Assistant:

static inline char32_t decode_utf8(const std::string &str, size_t &i)
{
    char c0 = str[i];
    if ((c0 & 0x80) == 0) {  // 0xxxxxxx
        return c0;
    } else if ((c0 & 0xE0) == 0xC0) {  // 110yyyxx 10xxxxxx
        if (i + 1 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0x1F) << 6ul) | (c1 & 0x3F);
    } else if ((c0 & 0xF0) == 0xE0) {  // 1110yyyy 10yyyyxx 10xxxxxx
        if (i + 2 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c2 = str[++i];
        if ((c2 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0xF) << 12ul) | ((c1 & 0x3F) << 6) | (c2 & 0x3F);
    } else if ((c0 & 0xF8) == 0xF0) {  // 11110zzz 10zzyyyy 10yyyyxx 10xxxxxx
        if (i + 3 >= str.length()) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c1 = str[++i];
        if ((c1 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c2 = str[++i];
        if ((c2 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        char c3 = str[++i];
        if ((c3 & 0xC0) != 0x80) {
            return JSONNET_CODEPOINT_ERROR;
        }
        return ((c0 & 0x7) << 18ul) | ((c1 & 0x3F) << 12ul) | ((c2 & 0x3F) << 6) | (c3 & 0x3F);
    } else {
        return JSONNET_CODEPOINT_ERROR;
    }
}